

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O0

void __thiscall
soplex::SPxVectorST<double>::setupWeights(SPxVectorST<double> *this,SPxSolverBase<double> *base)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  bool *pbVar5;
  SVectorBase<double> *pSVar6;
  uint n;
  int __c;
  SPxVectorST<double> *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Real RVar12;
  SVectorBase<double> *col;
  int j;
  int i_1;
  double len;
  double y_1;
  double x_1;
  SVectorBase<double> *row;
  int i;
  double y;
  double x;
  double bias;
  double eps;
  VectorBase<double> *obj;
  SPxSolverBase<double> *in_stack_00000258;
  SPxWeightST<double> *in_stack_00000260;
  int in_stack_fffffffffffffebc;
  SPxLPBase<double> *in_stack_fffffffffffffec0;
  SVectorBase<double> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  uint local_68;
  int local_64;
  double local_60;
  double local_58;
  int local_3c;
  
  if (in_RDI->state == PVEC) {
    iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2ddae8);
    iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2ddafc);
    if (iVar2 == iVar3) {
      SPxLPBase<double>::maxObj((SPxLPBase<double> *)0x2ddb30);
      dVar7 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2ddb45);
      dVar8 = dVar7 * 10000.0;
      SPxOut::debug<soplex::SPxVectorST<double>,_const_char_(&)[23],_0>
                (in_RDI,(char (*) [23])"DVECST01 colWeight[]: ");
      local_3c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2ddb89);
      while (iVar2 = local_3c + -1, local_3c != 0) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffebc);
        dVar11 = *pdVar4;
        pdVar4 = SPxLPBase<double>::lower(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        dVar10 = *pdVar4;
        pdVar4 = SPxLPBase<double>::upper(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        dVar9 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffebc);
        dVar1 = *pdVar4;
        if (dVar9 - dVar1 <= dVar11 - dVar10) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffebc);
          dVar11 = *pdVar4;
          pdVar4 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          *pdVar4 = -(dVar9 - dVar1) + dVar8 * dVar11;
          pbVar5 = DataArray<bool>::operator[](&(in_RDI->super_SPxWeightST<double>).colUp,iVar2);
          *pbVar5 = true;
        }
        else {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffebc);
          dVar9 = *pdVar4;
          pdVar4 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          *pdVar4 = -(dVar11 - dVar10) - dVar8 * dVar9;
          pbVar5 = DataArray<bool>::operator[](&(in_RDI->super_SPxWeightST<double>).colUp,iVar2);
          *pbVar5 = false;
        }
        pdVar4 = Array<double>::operator[]
                           ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        SPxOut::debug<soplex::SPxVectorST<double>,_const_char_(&)[4],_double_&,_0>
                  (in_RDI,(char (*) [4])"{} ",pdVar4);
        local_3c = iVar2;
      }
      SPxOut::debug<soplex::SPxVectorST<double>,_const_char_(&)[4],_0>(in_RDI,(char (*) [4])"\n \n")
      ;
      SPxOut::debug<soplex::SPxVectorST<double>,_const_char_(&)[23],_0>
                (in_RDI,(char (*) [23])"DVECST02 rowWeight[]: ");
      local_3c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2dde44);
      while (iVar2 = local_3c + -1, local_3c != 0) {
        pSVar6 = SPxLPBase<double>::rowVector(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        dVar9 = VectorBase<double>::operator*
                          ((VectorBase<double> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffed8);
        pdVar4 = SPxLPBase<double>::lhs(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        dVar11 = *pdVar4;
        pdVar4 = SPxLPBase<double>::rhs(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        dVar10 = *pdVar4;
        if (dVar10 - dVar9 <= dVar9 - dVar11) {
          iVar3 = SVectorBase<double>::size(pSVar6);
          dVar11 = VectorBase<double>::operator*
                             ((VectorBase<double> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              in_stack_fffffffffffffed8);
          pdVar4 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          *pdVar4 = (-(dVar10 - dVar9) - dVar7 * (double)iVar3) + dVar8 * dVar11;
          pbVar5 = DataArray<bool>::operator[](&(in_RDI->super_SPxWeightST<double>).rowRight,iVar2);
          *pbVar5 = true;
        }
        else {
          iVar3 = SVectorBase<double>::size(pSVar6);
          dVar10 = VectorBase<double>::operator*
                             ((VectorBase<double> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              in_stack_fffffffffffffed8);
          pdVar4 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          *pdVar4 = (-(dVar9 - dVar11) - dVar7 * (double)iVar3) - dVar8 * dVar10;
          pbVar5 = DataArray<bool>::operator[](&(in_RDI->super_SPxWeightST<double>).rowRight,iVar2);
          *pbVar5 = false;
        }
        pdVar4 = Array<double>::operator[]
                           ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        SPxOut::debug<soplex::SPxVectorST<double>,_const_char_(&)[4],_double_&,_0>
                  (in_RDI,(char (*) [4])"{} ",pdVar4);
        local_3c = iVar2;
      }
      SPxOut::debug<soplex::SPxVectorST<double>,_const_char_(&)[2],_0>
                (in_RDI,(char (*) [2])0x48cd6a);
    }
    else {
      SPxWeightST<double>::setupWeights(in_stack_00000260,in_stack_00000258);
    }
  }
  else if (in_RDI->state == DVEC) {
    iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2de161);
    iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2de172);
    if (iVar2 == iVar3) {
      local_64 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2de1a3);
      while (local_64 != 0) {
        pdVar4 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffebc);
        RVar12 = spxAbs<double>(*pdVar4);
        pdVar4 = Array<double>::operator[]
                           ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        *pdVar4 = RVar12 + *pdVar4;
        local_64 = local_64 + -1;
      }
      local_64 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2de221);
      while (iVar2 = local_64 + -1, local_64 != 0) {
        pSVar6 = SPxLPBase<double>::colVector(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        local_60 = 0.0;
        local_58 = 0.0;
        local_68 = SVectorBase<double>::size(pSVar6);
        while (n = local_68 - 1, local_68 != 0) {
          pdVar4 = SVectorBase<double>::value(pSVar6,n);
          dVar7 = *pdVar4;
          SVectorBase<double>::index(pSVar6,(char *)(ulong)n,__c);
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffebc);
          local_58 = *pdVar4 * dVar7 + local_58;
          local_60 = dVar7 * dVar7 + local_60;
          local_68 = n;
        }
        local_64 = iVar2;
        if (0.0 < local_60) {
          in_stack_fffffffffffffec0 = (SPxLPBase<double> *)(local_58 / local_60);
          pdVar4 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          RVar12 = spxAbs<double>((double)in_stack_fffffffffffffec0 - *pdVar4);
          pdVar4 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          *pdVar4 = RVar12 + *pdVar4;
        }
      }
    }
    else {
      SPxWeightST<double>::setupWeights(in_stack_00000260,in_stack_00000258);
    }
  }
  else {
    SPxWeightST<double>::setupWeights(in_stack_00000260,in_stack_00000258);
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}